

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkEnum
          (DescriptorBuilder *this,EnumDescriptor *enum_type,EnumDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  EnumOptions *pEVar3;
  EnumValueDescriptorProto *pEVar4;
  int local_24;
  int i;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *enum_type_local;
  DescriptorBuilder *this_local;
  
  if (*(long *)(enum_type + 0x20) == 0) {
    pEVar3 = EnumOptions::default_instance();
    *(EnumOptions **)(enum_type + 0x20) = pEVar3;
  }
  local_24 = 0;
  while( true ) {
    iVar2 = EnumDescriptor::value_count(enum_type);
    if (iVar2 <= local_24) break;
    lVar1 = *(long *)(enum_type + 0x30);
    pEVar4 = EnumDescriptorProto::value(proto,local_24);
    CrossLinkEnumValue(this,(EnumValueDescriptor *)(lVar1 + (long)local_24 * 0x28),pEVar4);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkEnum(
    EnumDescriptor* enum_type, const EnumDescriptorProto& proto) {
  if (enum_type->options_ == NULL) {
    enum_type->options_ = &EnumOptions::default_instance();
  }

  for (int i = 0; i < enum_type->value_count(); i++) {
    CrossLinkEnumValue(&enum_type->values_[i], proto.value(i));
  }
}